

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O3

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  long offset;
  bool bVar1;
  int iVar2;
  uint uVar3;
  mode_t mVar4;
  int iVar5;
  char *pcVar6;
  la_int64_t lVar7;
  char *pcVar8;
  ulong uVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  size_t __size;
  long lVar14;
  uint *puVar15;
  stat s;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  uint local_ff0 [1008];
  ssize_t sVar9;
  
  archive_clear_error(_a);
  pcVar6 = archive_entry_sourcepath(entry);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (fd < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar2 = lstat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar11 = __errno_location();
            iVar2 = *piVar11;
            pcVar8 = "Can\'t lstat %s";
            goto LAB_004156e5;
          }
        }
        else {
          st = &local_10c8;
          iVar2 = stat(pcVar6,(stat *)st);
          if (iVar2 != 0) {
            piVar11 = __errno_location();
            iVar2 = *piVar11;
            pcVar8 = "Can\'t stat %s";
LAB_004156e5:
            archive_set_error(_a,iVar2,pcVar8,pcVar6);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar2 = fstat(fd,(stat *)st);
        if (iVar2 != 0) {
          piVar11 = __errno_location();
          iVar2 = *piVar11;
          pcVar6 = "Can\'t fstat";
          goto LAB_00415595;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar7 = archive_entry_uid(entry);
  pcVar8 = archive_read_disk_uname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar8);
  }
  lVar7 = archive_entry_gid(entry);
  pcVar8 = archive_read_disk_gname(_a,lVar7);
  if (pcVar8 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar8);
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    __size = st->st_size + 1;
    pcVar8 = (char *)malloc(__size);
    if (pcVar8 == (char *)0x0) {
      pcVar6 = "Couldn\'t read link data";
      iVar2 = 0xc;
LAB_00415595:
      archive_set_error(_a,iVar2,pcVar6);
      return -0x19;
    }
    if (*(long *)&_a[1].archive_format == 0) {
      sVar9 = readlink(pcVar6,pcVar8,__size);
      uVar3 = (uint)sVar9;
    }
    else {
      iVar2 = (**(code **)&_a[1].compression_code)();
      sVar9 = readlinkat(iVar2,pcVar6,pcVar8,__size);
      uVar3 = (uint)sVar9;
    }
    if ((int)uVar3 < 0) {
      piVar11 = __errno_location();
      archive_set_error(_a,*piVar11,"Couldn\'t read link data");
      free(pcVar8);
      return -0x19;
    }
    pcVar8[uVar3 & 0x7fffffff] = '\0';
    archive_entry_set_symlink(entry,pcVar8);
    free(pcVar8);
  }
  mVar4 = archive_entry_filetype(entry);
  iVar2 = fd;
  if (((mVar4 == 0x8000) && (lVar7 = archive_entry_size(entry), 0 < lVar7)) &&
     (pcVar6 = archive_entry_hardlink(entry), pcVar6 == (char *)0x0)) {
    if (fd < 0) {
      pcVar6 = archive_entry_sourcepath(entry);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = archive_entry_pathname(entry);
      }
      if (*(long *)&_a[1].archive_format == 0) {
        iVar2 = open(pcVar6,0x80800);
      }
      else {
        iVar2 = (*(code *)_a[1].archive_format_name)(*(long *)&_a[1].archive_format,pcVar6,0x80800);
      }
      if (iVar2 < 0) {
        piVar11 = __errno_location();
        archive_set_error(_a,*piVar11,"Can\'t open `%s\'",pcVar6);
        iVar5 = -0x19;
        goto LAB_00415603;
      }
      __archive_ensure_cloexec_flag(iVar2);
    }
    memset(local_1038,0,0x1000);
    local_1038[1] = 0xffffffffffffffff;
    local_1028 = 1;
    local_1020 = 0x48;
    uVar10 = archive_entry_size(entry);
    iVar5 = ioctl(iVar2,0xc020660b,local_1038);
    if ((-1 < iVar5) && (local_1024 != 0)) {
      do {
        uVar3 = local_1024;
        if (0 < (int)local_1024) {
          bVar1 = true;
          iVar5 = 0;
          puVar15 = local_ff0;
          do {
            uVar12 = *puVar15;
            if ((uVar12 >> 0xb & 1) == 0) {
              offset = *(long *)(puVar15 + -10);
              uVar13 = offset + *(long *)(puVar15 + -6);
              lVar14 = uVar13 - uVar10;
              if (uVar13 < uVar10) {
                lVar14 = 0;
              }
              uVar13 = *(long *)(puVar15 + -6) - lVar14;
              if (uVar13 == uVar10 && offset == 0) goto LAB_00415600;
              if (0 < (long)uVar13) {
                archive_entry_sparse_add_entry(entry,offset,uVar13);
                uVar12 = *puVar15;
                uVar3 = local_1024;
              }
            }
            if ((uVar12 & 1) != 0) {
              bVar1 = false;
            }
            iVar5 = iVar5 + 1;
            puVar15 = puVar15 + 0xe;
          } while (iVar5 < (int)uVar3);
          if (!bVar1) break;
        }
        local_1038[0] =
             local_1038[(ulong)uVar3 * 7 + -1] + local_10c8.__glibc_reserved[(ulong)uVar3 * 7];
        iVar5 = ioctl(iVar2,0xc020660b,local_1038);
        if ((iVar5 < 0) || (local_1024 == 0)) break;
      } while( true );
    }
  }
LAB_00415600:
  iVar5 = 0;
LAB_00415603:
  if (iVar2 != fd) {
    close(iVar2);
  }
  return iVar5;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if (st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS)
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd, EXT2_IOC_GETFLAGS, &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size + 1;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = 0;
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = setup_acls(a, entry, &fd);
	if (!a->suppress_xattr) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->enable_copyfile) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	r1 = setup_sparse(a, entry, &fd);
	if (r1 < r)
		r = r1;

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}